

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubtreeWrapper.cpp
# Opt level: O0

unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> __thiscall
IRT::CRelativeConditionalWrapper::ToConditional
          (CRelativeConditionalWrapper *this,CLabel *labelTrue,CLabel *labelFalse)

{
  TLogicOperator _operation;
  CJumpConditionalStatement *this_00;
  CLabelStatement *pCVar1;
  CLabel *in_RCX;
  CLabel local_b8;
  unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_> local_98;
  unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_> local_90;
  undefined1 local_81;
  CLabel local_80;
  unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_> local_50;
  unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_> local_48;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_40;
  unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> local_38;
  unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> local_30 [2];
  CLabel *labelFalse_local;
  CLabel *labelTrue_local;
  CRelativeConditionalWrapper *this_local;
  
  labelFalse_local = labelFalse;
  labelTrue_local = labelTrue;
  this_local = this;
  this_00 = (CJumpConditionalStatement *)operator_new(0x30);
  _operation = labelTrue->field_0x8;
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_38,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &labelTrue->field_0x10);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::unique_ptr
            (&local_40,
             (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
             &labelTrue->field_0x18);
  pCVar1 = (CLabelStatement *)operator_new(0x28);
  local_81 = 1;
  CLabel::CLabel(&local_80,labelFalse);
  CLabelStatement::CLabelStatement(pCVar1,&local_80);
  local_81 = 0;
  std::unique_ptr<IRT::CLabelStatement_const,std::default_delete<IRT::CLabelStatement_const>>::
  unique_ptr<std::default_delete<IRT::CLabelStatement_const>,void>
            ((unique_ptr<IRT::CLabelStatement_const,std::default_delete<IRT::CLabelStatement_const>>
              *)&local_50,pCVar1);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  unique_ptr(&local_48,&local_50);
  pCVar1 = (CLabelStatement *)operator_new(0x28);
  CLabel::CLabel(&local_b8,in_RCX);
  CLabelStatement::CLabelStatement(pCVar1,&local_b8);
  std::unique_ptr<IRT::CLabelStatement_const,std::default_delete<IRT::CLabelStatement_const>>::
  unique_ptr<std::default_delete<IRT::CLabelStatement_const>,void>
            ((unique_ptr<IRT::CLabelStatement_const,std::default_delete<IRT::CLabelStatement_const>>
              *)&local_98,pCVar1);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  unique_ptr(&local_90,&local_98);
  CJumpConditionalStatement::CJumpConditionalStatement
            (this_00,_operation,&local_38,&local_40,&local_48,&local_90);
  std::unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>>::
  unique_ptr<std::default_delete<IRT::CStatement_const>,void>
            ((unique_ptr<IRT::CStatement_const,std::default_delete<IRT::CStatement_const>> *)
             local_30,(pointer)this_00);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::unique_ptr
            ((unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *)this,
             local_30);
  std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>::~unique_ptr
            (local_30);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  ~unique_ptr(&local_90);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  ~unique_ptr(&local_98);
  CLabel::~CLabel(&local_b8);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  ~unique_ptr(&local_48);
  std::unique_ptr<const_IRT::CLabelStatement,_std::default_delete<const_IRT::CLabelStatement>_>::
  ~unique_ptr(&local_50);
  CLabel::~CLabel(&local_80);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_40);
  std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>::~unique_ptr
            (&local_38);
  return (__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
          )(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<const CStatement>
    CRelativeConditionalWrapper::ToConditional( CLabel labelTrue, CLabel labelFalse ) {
        return std::move( std::unique_ptr<const CStatement>(
                new CJumpConditionalStatement(
                        operatorType,
                        std::move( operandLeft ),
                        std::move( operandRight ),
                        std::move( std::unique_ptr<const CLabelStatement>( new CLabelStatement( labelTrue ))),
                        std::move( std::unique_ptr<const CLabelStatement>( new CLabelStatement( labelFalse )))
                )
        ));
    }